

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cache.cc
# Opt level: O1

Handle * __thiscall
leveldb::anon_unknown_0::ShardedLRUCache::Lookup(ShardedLRUCache *this,Slice *key)

{
  long lVar1;
  LRUHandle *pLVar2;
  LRUHandle *pLVar3;
  uint32_t uVar4;
  uint uVar5;
  int iVar6;
  LRUHandle **ppLVar7;
  Mutex *__mutex;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  uVar4 = Hash(key->data_,key->size_,0);
  uVar5 = uVar4 >> 0x1c;
  __mutex = &this->shard_[uVar5].mutex_;
  iVar6 = pthread_mutex_lock((pthread_mutex_t *)__mutex);
  if (iVar6 == 0) {
    ppLVar7 = HandleTable::FindPointer(&this->shard_[uVar5].table_,key,uVar4);
    pLVar2 = *ppLVar7;
    if (pLVar2 != (LRUHandle *)0x0) {
      uVar4 = pLVar2->refs;
      if ((uVar4 == 1) && (pLVar2->in_cache == true)) {
        pLVar3 = pLVar2->next;
        pLVar3->prev = pLVar2->prev;
        pLVar2->prev->next = pLVar3;
        pLVar2->next = &this->shard_[uVar5].in_use_;
        pLVar3 = this->shard_[uVar5].in_use_.prev;
        pLVar2->prev = pLVar3;
        pLVar3->next = pLVar2;
        pLVar2->next->prev = pLVar2;
      }
      pLVar2->refs = uVar4 + 1;
    }
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      pthread_mutex_unlock((pthread_mutex_t *)__mutex);
      return (Handle *)pLVar2;
    }
  }
  else if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    std::__throw_system_error(iVar6);
  }
  __stack_chk_fail();
}

Assistant:

Handle* Lookup(const Slice& key) override {
    const uint32_t hash = HashSlice(key);
    return shard_[Shard(hash)].Lookup(key, hash);
  }